

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 jx9CompileContinue(jx9_gen_state *pGen)

{
  sxu32 nLine;
  SyToken *pSVar1;
  SyToken *pSVar2;
  uint uVar3;
  sxi32 sVar4;
  ulong uVar5;
  ulong uVar6;
  sxi32 sVar7;
  GenBlock *pBlock;
  GenBlock *pGVar8;
  sxu32 nInstrIdx;
  JumpFixup sJumpFix;
  sxu32 local_24 [3];
  
  pSVar1 = pGen->pIn;
  nLine = pSVar1->nLine;
  pSVar2 = pSVar1 + 1;
  pGen->pIn = pSVar2;
  uVar6 = 0;
  if ((pSVar2 < pGen->pEnd) && ((pSVar1[1].nType & 3) != 0)) {
    uVar5 = jx9TokenValueToInt64(&pSVar2->sData);
    uVar6 = 0;
    if (1 < (int)uVar5) {
      uVar6 = uVar5 & 0xffffffff;
    }
    pGen->pIn = pGen->pIn + 1;
  }
  pGVar8 = pGen->pCurrent;
  uVar3 = pGVar8->iFlags;
  do {
    if ((uVar3 & 1) != 0) {
      if ((int)uVar6 < 2) {
        local_24[0] = 0;
        jx9VmEmitInstr(pGen->pVm,8,0,pGVar8->nFirstInstr,(void *)0x0,local_24);
        if (pGVar8->bPostContinue == '\x01') {
          local_24[1] = 8;
          local_24[2] = local_24[0];
          SySetPut(&pGVar8->aPostContFix,local_24 + 1);
        }
        goto LAB_00126ede;
      }
      uVar6 = (ulong)((int)uVar6 - 1);
    }
    pGVar8 = pGVar8->pParent;
  } while ((pGVar8 != (GenBlock *)0x0) && (uVar3 = pGVar8->iFlags, (uVar3 & 10) == 0));
  sVar4 = jx9GenCompileError(pGen,1,nLine,
                             "A \'continue\' statement may only be used within a loop or switch");
  sVar7 = -10;
  if (sVar4 != -10) {
LAB_00126ede:
    pSVar2 = pGen->pIn;
    sVar7 = 0;
    if ((pSVar2 < pGen->pEnd) && ((pSVar2->nType & 0x40000) == 0)) {
      sVar7 = 0;
      jx9GenCompileError(pGen,2,pSVar2->nLine,
                         "Expected semi-colon \';\' after \'continue\' statement");
    }
  }
  return sVar7;
}

Assistant:

static sxi32 jx9CompileContinue(jx9_gen_state *pGen)
{
	GenBlock *pLoop; /* Target loop */
	sxi32 iLevel;    /* How many nesting loop to skip */
	sxu32 nLine;
	sxi32 rc;
	nLine = pGen->pIn->nLine;
	iLevel = 0;
	/* Jump the 'continue' keyword */
	pGen->pIn++;
	if( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_NUM) ){
		/* optional numeric argument which tells us how many levels
		 * of enclosing loops we should skip to the end of. 
		 */
		iLevel = (sxi32)jx9TokenValueToInt64(&pGen->pIn->sData);
		if( iLevel < 2 ){
			iLevel = 0;
		}
		pGen->pIn++; /* Jump the optional numeric argument */
	}
	/* Point to the target loop */
	pLoop = GenStateFetchBlock(pGen->pCurrent, GEN_BLOCK_LOOP, iLevel);
	if( pLoop == 0 ){
		/* Illegal continue */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "A 'continue' statement may only be used within a loop or switch");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
	}else{
		sxu32 nInstrIdx = 0;
		/* Emit the unconditional jump to the beginning of the target loop */
		jx9VmEmitInstr(pGen->pVm, JX9_OP_JMP, 0, pLoop->nFirstInstr, 0, &nInstrIdx);
		if( pLoop->bPostContinue == TRUE ){
			JumpFixup sJumpFix;
			/* Post-continue */
			sJumpFix.nJumpType = JX9_OP_JMP;
			sJumpFix.nInstrIdx = nInstrIdx;
			SySetPut(&pLoop->aPostContFix, (const void *)&sJumpFix);
		}
	}
	if( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_SEMI) == 0 ){
		/* Not so fatal, emit a warning only */
		jx9GenCompileError(&(*pGen), E_WARNING, pGen->pIn->nLine, "Expected semi-colon ';' after 'continue' statement");
	}
	/* Statement successfully compiled */
	return SXRET_OK;
}